

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O3

Result wabt::WriteBinarySpecScript
                 (Stream *json_stream,WriteBinarySpecStreamFactory *module_stream_factory,
                 Script *script,string_view source_filename,string_view module_filename_noext,
                 WriteBinaryOptions *options)

{
  _Manager_type p_Var1;
  Result RVar2;
  BinaryWriterSpec binary_writer_spec;
  _Any_data local_d8;
  _Manager_type local_c8;
  _Invoker_type p_Stack_c0;
  BinaryWriterSpec local_b8;
  
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c8 = (_Manager_type)0x0;
  p_Stack_c0 = (_Invoker_type)0x0;
  p_Var1 = (module_stream_factory->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_d8,(_Any_data *)module_stream_factory,__clone_functor);
    local_c8 = (module_stream_factory->super__Function_base)._M_manager;
    p_Stack_c0 = module_stream_factory->_M_invoker;
  }
  anon_unknown_1::BinaryWriterSpec::BinaryWriterSpec
            (&local_b8,json_stream,(WriteBinarySpecStreamFactory *)&local_d8,source_filename,
             module_filename_noext,options);
  if (local_c8 != (_Manager_type)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  RVar2 = anon_unknown_1::BinaryWriterSpec::WriteScript(&local_b8,script);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.module_filename_noext_._M_dataplus._M_p !=
      &local_b8.module_filename_noext_.field_2) {
    operator_delete(local_b8.module_filename_noext_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.source_filename_._M_dataplus._M_p != &local_b8.source_filename_.field_2) {
    operator_delete(local_b8.source_filename_._M_dataplus._M_p);
  }
  if (local_b8.module_stream_factory_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b8.module_stream_factory_.super__Function_base._M_manager)
              ((_Any_data *)&local_b8.module_stream_factory_,
               (_Any_data *)&local_b8.module_stream_factory_,__destroy_functor);
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result WriteBinarySpecScript(Stream* json_stream,
                             WriteBinarySpecStreamFactory module_stream_factory,
                             Script* script,
                             string_view source_filename,
                             string_view module_filename_noext,
                             const WriteBinaryOptions& options) {
  BinaryWriterSpec binary_writer_spec(json_stream, module_stream_factory,
                                      source_filename, module_filename_noext,
                                      options);
  return binary_writer_spec.WriteScript(*script);
}